

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

void __thiscall
clip_model_loader::get_bool(clip_model_loader *this,string *key,bool *output,bool required)

{
  byte bVar1;
  int iVar2;
  pointer pgVar3;
  undefined8 uVar4;
  runtime_error *this_00;
  undefined1 in_CL;
  byte *in_RDX;
  unique_ptr<gguf_context,_gguf_context_deleter> *in_RDI;
  int i;
  string local_40 [32];
  undefined3 in_stack_ffffffffffffffe4;
  uint uVar5;
  
  uVar5 = CONCAT13(in_CL,in_stack_ffffffffffffffe4) & 0x1ffffff;
  pgVar3 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get(in_RDI);
  uVar4 = std::__cxx11::string::c_str();
  iVar2 = gguf_find_key(pgVar3,uVar4);
  if (iVar2 < 0) {
    if ((uVar5 & 0x1000000) != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((char *)in_RDX,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(uVar5,iVar2));
      std::runtime_error::runtime_error(this_00,local_40);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    pgVar3 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get(in_RDI);
    bVar1 = gguf_get_val_bool(pgVar3,(long)iVar2);
    *in_RDX = bVar1 & 1;
  }
  return;
}

Assistant:

void get_bool(const std::string & key, bool & output, bool required = true) {
        const int i = gguf_find_key(ctx_gguf.get(), key.c_str());
        if (i < 0) {
            if (required) throw std::runtime_error("Key not found: " + key);
            return;
        }
        output = gguf_get_val_bool(ctx_gguf.get(), i);
    }